

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

Token * __thiscall slang::syntax::SyntaxNode::getLastTokenPtr(SyntaxNode *this)

{
  SyntaxNode *this_00;
  SyntaxNode *pSVar1;
  Token *pTVar2;
  undefined1 extraout_DL;
  undefined1 uVar3;
  char extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined7 extraout_var;
  undefined7 uVar4;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  _Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> local_30 [2];
  
  this_00 = (SyntaxNode *)getChildCount(this);
  uVar3 = extraout_DL;
  uVar4 = extraout_var;
  do {
    do {
      while( true ) {
        if ((long)this_00 < 1) {
          return (Token *)0x0;
        }
        this_00 = (SyntaxNode *)((long)&this_00[-1].previewNode + 7);
        local_30[0] = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)
                      getChildPtr((PtrTokenOrSyntax *)this,this_00,CONCAT71(uVar4,uVar3));
        if (extraout_DL_00 != '\0') break;
        pTVar2 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)&local_30[0]._M_first);
        uVar3 = extraout_DL_03;
        uVar4 = extraout_var_02;
        if (pTVar2 != (Token *)0x0) {
          pTVar2 = PtrTokenOrSyntax::token((PtrTokenOrSyntax *)&local_30[0]._M_first);
          return pTVar2;
        }
      }
      pSVar1 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)&local_30[0]._M_first);
      uVar3 = extraout_DL_01;
      uVar4 = extraout_var_00;
    } while (pSVar1 == (SyntaxNode *)0x0);
    pSVar1 = PtrTokenOrSyntax::node((PtrTokenOrSyntax *)&local_30[0]._M_first);
    pTVar2 = getLastTokenPtr(pSVar1);
    uVar3 = extraout_DL_02;
    uVar4 = extraout_var_01;
  } while (pTVar2 == (Token *)0x0);
  return pTVar2;
}

Assistant:

parsing::Token* SyntaxNode::getLastTokenPtr() {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChildPtr(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}